

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

void initZxLikeDevice(CDevice *device,int32_t slotSize,int pageCount,int *initialPages,aint ramtop)

{
  undefined4 in_register_00000014;
  int iVar1;
  long lVar2;
  
  initRegularSlotDevice(device,0x4000,4,slotSize,(int *)CONCAT44(in_register_00000014,pageCount));
  iVar1 = 0x5d5b;
  if ((int)initialPages - 0x5d00U < 0xa300) {
    iVar1 = (int)initialPages;
  }
  device->ZxRamTop = iVar1;
  iVar1 = 0x5800;
  do {
    CDevice::Poke(device,iVar1,'8');
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x5b00);
  lVar2 = 0;
  do {
    CDevice::Poke(device,(int)lVar2 + 0xff58,""[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xa8);
  lVar2 = 0;
  do {
    CDevice::Poke(device,(int)lVar2 + 0x5c00,ZX_SYSVARS_DATA[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  CDevice::Poke(device,0x5cb2,(byte)device->ZxRamTop);
  CDevice::Poke(device,0x5cb3,*(byte *)((long)&device->ZxRamTop + 1));
  iVar1 = device->ZxRamTop + -3;
  CDevice::Poke(device,0x5c3d,(byte)iVar1);
  CDevice::Poke(device,0x5c3e,(byte)((uint)iVar1 >> 8));
  lVar2 = 0;
  do {
    CDevice::Poke(device,iVar1 + (int)lVar2,"\x03\x13"[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

static void initZxLikeDevice(
	CDevice* const device, int32_t slotSize, int pageCount, const int* const initialPages, aint ramtop)
{
	initRegularSlotDevice(device, slotSize, 0x10000/slotSize, pageCount, initialPages);
	device->ZxRamTop = (0x5D00 <= ramtop && ramtop <= 0xFFFF) ? ramtop : ZX_RAMTOP_DEFAULT;

	// set memory to state like if (for snapshot saving):
		// CLEAR ZxRamTop (0x5D5B default) : LOAD "bin" CODE : ... USR start_adr
	aint adr;
	// ULA attributes: INK 0 : PAPER 7 : FLASH 0 : BRIGTH 0
	for (adr = 0x5800; adr < 0x5B00; ++adr) device->Poke(adr, 7*8);

	// set UDG data at ZX_UDG_ADR (0xFF58)
	adr = ZX_UDG_ADR;
	for (byte value : ZX_UDG_DATA) device->Poke(adr++, value);

	// ZX SYSVARS at 0x5C00
	adr = ZX_SYSVARS_ADR;
	for (byte value : ZX_SYSVARS_DATA) device->Poke(adr++, value);
	// set RAMTOP sysvar
	device->Poke(ZX_SYSVARS_ADR+0xB2, device->ZxRamTop & 0xFF);
	device->Poke(ZX_SYSVARS_ADR+0xB3, (device->ZxRamTop>>8) & 0xFF);

	// set STACK data (without the "start" address)
	adr = device->ZxRamTop + 1 - sizeof(ZX_STACK_DATA);
	// set ERRSP sysvar to beginning of the fake stack
	device->Poke(ZX_SYSVARS_ADR+0x3D, adr & 0xFF);
	device->Poke(ZX_SYSVARS_ADR+0x3E, (adr>>8) & 0xFF);
	for (byte value : ZX_STACK_DATA) device->Poke(adr++, value);
}